

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_slice * cram_new_slice(cram_content_type type,int nrecs)

{
  cram_slice *s_00;
  cram_block_slice_hdr *pcVar1;
  cram_record *pcVar2;
  cram_block *pcVar3;
  string_alloc_t *psVar4;
  kh_m_s2i_t *pkVar5;
  cram_slice *s;
  int nrecs_local;
  cram_content_type type_local;
  
  s_00 = (cram_slice *)calloc(1,0x100);
  if (s_00 != (cram_slice *)0x0) {
    pcVar1 = (cram_block_slice_hdr *)calloc(1,0x48);
    s_00->hdr = pcVar1;
    if (pcVar1 != (cram_block_slice_hdr *)0x0) {
      s_00->hdr->content_type = type;
      s_00->hdr_block = (cram_block *)0x0;
      s_00->block = (cram_block **)0x0;
      s_00->block_by_id = (cram_block **)0x0;
      s_00->last_apos = 0;
      pcVar2 = (cram_record *)malloc((long)nrecs * 0x70);
      s_00->crecs = pcVar2;
      if (pcVar2 != (cram_record *)0x0) {
        s_00->cigar = (uint32_t *)0x0;
        s_00->cigar_alloc = 0;
        s_00->ncigar = 0;
        pcVar3 = cram_new_block(EXTERNAL,0);
        s_00->seqs_blk = pcVar3;
        if (pcVar3 != (cram_block *)0x0) {
          pcVar3 = cram_new_block(EXTERNAL,0xc);
          s_00->qual_blk = pcVar3;
          if (pcVar3 != (cram_block *)0x0) {
            pcVar3 = cram_new_block(EXTERNAL,0xb);
            s_00->name_blk = pcVar3;
            if (pcVar3 != (cram_block *)0x0) {
              pcVar3 = cram_new_block(EXTERNAL,1);
              s_00->aux_blk = pcVar3;
              if (pcVar3 != (cram_block *)0x0) {
                pcVar3 = cram_new_block(EXTERNAL,0xd);
                s_00->base_blk = pcVar3;
                if (pcVar3 != (cram_block *)0x0) {
                  pcVar3 = cram_new_block(EXTERNAL,0xe);
                  s_00->soft_blk = pcVar3;
                  if (pcVar3 != (cram_block *)0x0) {
                    s_00->features = (cram_feature *)0x0;
                    s_00->afeatures = 0;
                    s_00->nfeatures = 0;
                    s_00->TN = (uint32_t *)0x0;
                    s_00->aTN = 0;
                    s_00->nTN = 0;
                    psVar4 = string_pool_create(0x2000);
                    s_00->pair_keys = psVar4;
                    if (psVar4 != (string_alloc_t *)0x0) {
                      pkVar5 = kh_init_m_s2i();
                      s_00->pair[0] = pkVar5;
                      if (pkVar5 != (kh_m_s2i_t *)0x0) {
                        pkVar5 = kh_init_m_s2i();
                        s_00->pair[1] = pkVar5;
                        if (pkVar5 != (kh_m_s2i_t *)0x0) {
                          return s_00;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (s_00 != (cram_slice *)0x0) {
      cram_free_slice(s_00);
    }
  }
  return (cram_slice *)0x0;
}

Assistant:

cram_slice *cram_new_slice(enum cram_content_type type, int nrecs) {
    cram_slice *s = calloc(1, sizeof(*s));
    if (!s)
	return NULL;

    if (!(s->hdr = (cram_block_slice_hdr *)calloc(1, sizeof(*s->hdr))))
	goto err;
    s->hdr->content_type = type;

    s->hdr_block = NULL;
    s->block = NULL;
    s->block_by_id = NULL;
    s->last_apos = 0;
    if (!(s->crecs = malloc(nrecs * sizeof(cram_record))))  goto err;
    s->cigar = NULL;
    s->cigar_alloc = 0;
    s->ncigar = 0;

    if (!(s->seqs_blk = cram_new_block(EXTERNAL, 0)))       goto err;
    if (!(s->qual_blk = cram_new_block(EXTERNAL, DS_QS)))   goto err;
    if (!(s->name_blk = cram_new_block(EXTERNAL, DS_RN)))   goto err;
    if (!(s->aux_blk  = cram_new_block(EXTERNAL, DS_aux)))  goto err;
    if (!(s->base_blk = cram_new_block(EXTERNAL, DS_IN)))   goto err;
    if (!(s->soft_blk = cram_new_block(EXTERNAL, DS_SC)))   goto err;

    s->features = NULL;
    s->nfeatures = s->afeatures = 0;

#ifndef TN_external
    s->TN = NULL;
    s->nTN = s->aTN = 0;
#endif

    // Volatile keys as we do realloc in dstring
    if (!(s->pair_keys = string_pool_create(8192))) goto err;
    if (!(s->pair[0] = kh_init(m_s2i)))             goto err;
    if (!(s->pair[1] = kh_init(m_s2i)))             goto err;
    
#ifdef BA_external
    s->BA_len = 0;
#endif

    return s;

 err:
    if (s)
	cram_free_slice(s);

    return NULL;
}